

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O2

uint8_t * pad_title_screen(uint8_t *pos,uint8_t *end,int reserved)

{
  uint8_t *puVar1;
  uint uVar2;
  uint32_t size;
  char text [32];
  
  puVar1 = (uint8_t *)0x20;
  if ((long)(end + ~(ulong)(pos + reserved)) < 0x20) {
    puVar1 = end + ~(ulong)(pos + reserved);
  }
  size = (uint32_t)puVar1;
  if ((int)size < 0) {
    puts("An unexpected error occurred while updating the title screen!");
  }
  else {
    builtin_strncpy(text + 0x10,"________________",0x10);
    builtin_strncpy(text,"________________",0x10);
    if (0x1f < size) goto LAB_00153fbc;
  }
  builtin_strncpy(text,"________________________________",0x20);
  uVar2 = 0x23 - size;
  size = size - 3;
  pos = pvpatch(pos,3,0xf7,(ulong)uVar2,0x5f);
LAB_00153fbc:
  puVar1 = ppatch(pos,size,(uint8_t *)text);
  puVar1 = pvpatch(puVar1,1,0xfc);
  return puVar1;
}

Assistant:

static uint8_t *pad_title_screen(uint8_t *pos, uint8_t *end, int reserved)
{
    char text[32];
    int needed;

    needed = MIN(end - pos - reserved - 1, 32);
    if (needed < 0) {
        printf("An unexpected error occurred while updating the title "
                       "screen!\n");
    }
    memset(text, 0x5f, 32);
    if (needed < 32) {
        needed -= 3;
        pos = pvpatch(pos, 3, 0xf7, 32 - needed, 0x5f);
    }
    pos = ppatch(pos, needed, (uint8_t*)text);
    pos = pvpatch(pos, 1, 0xfc);
    return pos;
}